

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_extend_rom.hpp
# Opt level: O0

void PatchExtendROM::add_bankswitching_when_checking_save_checksum(ROM *rom)

{
  size_t sVar1;
  uint32_t uVar2;
  Code *pCVar3;
  Code local_258;
  allocator<char> local_1d1;
  string local_1d0;
  uint32_t local_1ac;
  uint32_t func_check_save_checkum;
  DataRegister local_198;
  AddressRegister local_188;
  AddressInRegister local_178;
  allocator<char> local_151;
  string local_150;
  DataRegister local_130;
  Register local_120;
  DataRegister local_110;
  AddressRegister local_100;
  AddressInRegister local_f0;
  allocator<char> local_c9;
  string local_c8;
  Param local_98 [2];
  undefined1 local_88 [8];
  Code func;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  addr_<void>((uint32_t)local_98,0xa130f1);
  md::Code::moveb((Code *)local_88,'\x01',local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"loop",&local_c9);
  md::Code::label((Code *)local_88,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  md::AddressRegister::AddressRegister(&local_100,'\0');
  addr_<void>(&local_f0,&local_100);
  md::DataRegister::DataRegister(&local_110,'\x01');
  md::Code::addb((Code *)local_88,&local_f0.super_Param,&local_110,false);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_120,'\0');
  md::Code::addqw((Code *)local_88,'\x02',&local_120);
  md::DataRegister::DataRegister(&local_130,'\a');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"loop",&local_151);
  md::Code::dbra((Code *)local_88,&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  md::AddressRegister::AddressRegister(&local_188,'\0');
  addr_<void>(&local_178,&local_188);
  md::DataRegister::DataRegister(&local_198,'\x01');
  md::Code::cmpb((Code *)local_88,&local_178.super_Param,&local_198);
  addr_<void>((uint32_t)&stack0xfffffffffffffe58,0xa130f1);
  md::Code::moveb((Code *)local_88,'\0',(Param *)&stack0xfffffffffffffe58);
  md::Code::rts((Code *)local_88);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"",&local_1d1);
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_88,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_258._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_258._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_258._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_258._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258._labels._M_t._M_impl._0_8_ = 0;
  local_258._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_258._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_258._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_258._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_258._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._pending_branches._M_t._M_impl._0_8_ = 0;
  local_258._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1ac = uVar2;
  md::Code::Code(&local_258);
  pCVar3 = md::Code::jsr(&local_258,local_1ac);
  pCVar3 = md::Code::nop(pCVar3,2);
  md::ROM::set_code((ROM *)sVar1,0x1574,pCVar3);
  md::Code::~Code(&local_258);
  md::Code::~Code((Code *)local_88);
  return;
}

Assistant:

static void add_bankswitching_when_checking_save_checksum(md::ROM& rom)
    {
        md::Code func;
        func.moveb(BANK_SRAM, addr_(0xA130F1)); // switch to SRAM
        {
            func.label("loop");
            {
                func.addb(addr_(reg_A0), reg_D1);
                func.addqw(2, reg_A0);
            }
            func.dbra(reg_D7, "loop");
            func.cmpb(addr_(reg_A0), reg_D1);
        }
        func.moveb(BANK_ROM, addr_(0xA130F1)); // switch to ROM
        func.rts();

        uint32_t func_check_save_checkum = rom.inject_code(func);

        rom.set_code(0x1574, md::Code().jsr(func_check_save_checkum).nop(2));
    }